

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:456:66)>
::destroy(SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:456:66)>
          *this)

{
  SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:456:66)>
  *this_local;
  
  freePromise<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::TestCase446::run()::__1>>
            (this);
  return;
}

Assistant:

void destroy() override {
    freePromise(this);
  }